

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGate1.hpp
# Opt level: O0

void __thiscall
qclab::qgates::PointerGate1<std::complex<double>_>::PointerGate1
          (PointerGate1<std::complex<double>_> *this,QGate1<std::complex<double>_> *gate,int offset)

{
  int offset_local;
  QGate1<std::complex<double>_> *gate_local;
  PointerGate1<std::complex<double>_> *this_local;
  
  QGate1<std::complex<double>_>::QGate1(&this->super_QGate1<std::complex<double>_>);
  (this->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00758868;
  *(int *)&(this->super_QGate1<std::complex<double>_>).field_0xc = offset;
  this->gate_ = gate;
  return;
}

Assistant:

PointerGate1( QGate1< T >* gate , const int offset = 0 )
        : offset_( offset )
        , gate_( gate )
        { }